

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O2

int ARKStepResStolerance(void *arkode_mem,realtype rabstol)

{
  int iVar1;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode::ARKStep","ARKStepResStolerance",
                    "arkode_mem = NULL illegal.");
    return -0x15;
  }
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    iVar1 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
  }
  else if (*(int *)((long)arkode_mem + 0x250) == 0) {
    msgfmt = "Attempt to call before ARKodeInit.";
    iVar1 = -0x17;
  }
  else {
    if (0.0 <= rabstol) {
      *(uint *)((long)arkode_mem + 0x50) = -(uint)(rabstol == 0.0) & 1;
      if (*(int *)((long)arkode_mem + 0x100) != 0) {
        *(undefined8 *)((long)arkode_mem + 0xf8) = 0;
        iVar1 = arkAllocVec((ARKodeMem)arkode_mem,*(N_Vector *)((long)arkode_mem + 0xf0),
                            (N_Vector *)((long)arkode_mem + 0xf8));
        if (iVar1 == 0) {
          arkProcessError((ARKodeMem)arkode_mem,-0x14,"ARKode","arkResStolerances",
                          "Allocation of arkode_mem failed.");
          return -0x16;
        }
        *(undefined4 *)((long)arkode_mem + 0x100) = 0;
      }
      *(realtype *)((long)arkode_mem + 0x40) = rabstol;
      *(undefined4 *)((long)arkode_mem + 0x1c) = 0;
      *(undefined4 *)((long)arkode_mem + 0x54) = 0;
      *(code **)((long)arkode_mem + 0x70) = arkRwtSet;
      *(void **)((long)arkode_mem + 0x78) = arkode_mem;
      return 0;
    }
    msgfmt = "rabstol has negative component(s) (illegal).";
    iVar1 = -0x16;
  }
  arkProcessError((ARKodeMem)arkode_mem,iVar1,"ARKode","arkResStolerances",msgfmt);
  return iVar1;
}

Assistant:

int ARKStepResStolerance(void *arkode_mem, realtype rabstol)
{
  /* unpack ark_mem, call arkResStolerance, and return */
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode::ARKStep",
                    "ARKStepResStolerance", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;
  return(arkResStolerance(ark_mem, rabstol));
}